

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void update_op_reg_list(m68k_info *info,cs_m68k_op *op,int write)

{
  uint32_t uVar1;
  m68k_op_mem *pmVar2;
  m68k_reg reg;
  
  switch(op->type) {
  default:
switchD_0023a77c_caseD_2:
    return;
  case M68K_OP_MEM:
    switch(op->address_mode) {
    case M68K_AM_REG_DIRECT_DATA:
    case M68K_AM_REG_DIRECT_ADDR:
      break;
    case M68K_AM_REGI_ADDR:
    case M68K_AM_REGI_ADDR_DISP:
      write = 0;
      break;
    case M68K_AM_REGI_ADDR_POST_INC:
    case M68K_AM_REGI_ADDR_PRE_DEC:
      write = 1;
      break;
    case M68K_AM_AREGI_INDEX_8_BIT_DISP:
    case M68K_AM_AREGI_INDEX_BASE_DISP:
    case M68K_AM_MEMI_POST_INDEX:
    case M68K_AM_MEMI_PRE_INDEX:
    case M68K_AM_PCI_INDEX_8_BIT_DISP:
    case M68K_AM_PCI_INDEX_BASE_DISP:
    case M68K_AM_PC_MEMI_POST_INDEX:
    case M68K_AM_PC_MEMI_PRE_INDEX:
      pmVar2 = &op->mem;
      op = (cs_m68k_op *)&op->mem;
      write = 0;
      add_reg_to_rw_list(info,pmVar2->index_reg,0);
      break;
    default:
      goto switchD_0023a77c_caseD_2;
    }
  case M68K_OP_REG:
    reg = (op->field_0).reg;
    break;
  case M68K_OP_REG_BITS:
    uVar1 = op->register_bits;
    update_bits_range(info,M68K_REG_D0,(uint8_t)uVar1,write);
    update_bits_range(info,M68K_REG_A0,(uint8_t)(uVar1 >> 8),write);
    update_bits_range(info,M68K_REG_FP0,(uint8_t)(uVar1 >> 0x10),write);
    return;
  case M68K_OP_REG_PAIR:
    add_reg_to_rw_list(info,(op->field_0).reg + M68K_REG_D0,write);
    reg = (op->field_0).reg_pair.reg_1 + M68K_REG_D0;
  }
  add_reg_to_rw_list(info,reg,write);
  return;
}

Assistant:

static void update_op_reg_list(m68k_info *info, cs_m68k_op *op, int write)
{
	switch ((int)op->type) {
		case M68K_OP_REG:
			add_reg_to_rw_list(info, op->reg, write);
			break;

		case M68K_OP_MEM:
			update_am_reg_list(info, op, write);
			break;

		case M68K_OP_REG_BITS:
			update_reg_list_regbits(info, op, write);
			break;

		case M68K_OP_REG_PAIR:
			add_reg_to_rw_list(info, M68K_REG_D0 + op->reg_pair.reg_0, write);
			add_reg_to_rw_list(info, M68K_REG_D0 + op->reg_pair.reg_1, write);
			break;
	}
}